

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O0

void findFittest(Generator *g,Pos *pos,uint64_t *fitness,double maxrad,double step)

{
  undefined8 uVar1;
  uint64_t uVar2;
  ulong *in_RDX;
  int *in_RSI;
  double in_XMM0_Qa;
  double dVar3;
  double dVar4;
  double in_XMM1_Qa;
  uint64_t fit;
  int z;
  int x;
  Pos p;
  double ang;
  double rad;
  int in_stack_000000d8;
  int in_stack_000000dc;
  Generator *in_stack_000000e0;
  int local_40;
  int iStack_3c;
  double local_38;
  double local_30;
  
  uVar1 = *(undefined8 *)in_RSI;
  for (local_30 = in_XMM1_Qa; local_30 <= in_XMM0_Qa; local_30 = in_XMM1_Qa + local_30) {
    for (local_38 = 0.0; local_38 <= 6.283185307179586; local_38 = in_XMM1_Qa / local_30 + local_38)
    {
      local_40 = (int)uVar1;
      dVar3 = sin(local_38);
      iStack_3c = (int)((ulong)uVar1 >> 0x20);
      dVar4 = cos(local_38);
      uVar2 = calcFitness(in_stack_000000e0,in_stack_000000dc,in_stack_000000d8);
      if (uVar2 < *in_RDX) {
        *in_RSI = local_40 + (int)(dVar3 * local_30);
        in_RSI[1] = iStack_3c + (int)(dVar4 * local_30);
        *in_RDX = uVar2;
      }
    }
  }
  return;
}

Assistant:

static
void findFittest(const Generator *g, Pos *pos, uint64_t *fitness, double maxrad, double step)
{
    double rad, ang;
    Pos p = *pos;
    for (rad = step; rad <= maxrad; rad += step)
    {
        for (ang = 0; ang <= PI*2; ang += step/rad)
        {
            int x = p.x + (int)(sin(ang) * rad);
            int z = p.z + (int)(cos(ang) * rad);
            uint64_t fit = calcFitness(g, x, z);
            // Then update pos and fitness if combined total is lower/better
            if (fit < *fitness)
            {
                pos->x = x;
                pos->z = z;
                *fitness = fit;
            }
        }
    }
}